

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  long lVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  char *pcVar5;
  int iVar6;
  IReporter **curr_rep;
  undefined8 *puVar7;
  IReporter **curr_rep_1;
  anon_union_24_2_13149d16_for_String_2 local_50;
  undefined1 local_38;
  
  if (this->m_entered == true) {
    if (*(char *)(g_cs + 0x115c) == '\0') {
      std::
      _Rb_tree<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::_Identity<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::less<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::allocator<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>>
      ::
      _M_insert_unique<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>const&>
                ((_Rb_tree<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::_Identity<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::less<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::allocator<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>>
                  *)(g_cs + 0x1128),
                 (vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                 (g_cs + 0x1110));
    }
    lVar1 = *(long *)(g_cs + 0x1118);
    puVar7 = (undefined8 *)(lVar1 + -0x28);
    *(undefined8 **)(g_cs + 0x1118) = puVar7;
    if ((*(char *)(lVar1 + -0x11) < '\0') && (pvVar2 = (void *)*puVar7, pvVar2 != (void *)0x0)) {
      operator_delete__(pvVar2);
    }
    iVar6 = std::uncaught_exceptions();
    if ((0 < iVar6) && ((*(byte *)(g_cs + 0x115d) & 1) != 0)) {
      puVar7 = *(undefined8 **)(g_cs + 0x10d0);
      puVar3 = *(undefined8 **)(g_cs + 0x10d8);
      if (puVar7 != puVar3) {
        do {
          plVar4 = (long *)*puVar7;
          String::String((String *)&local_50.data,
                         "exception thrown in subcase - will translate later when the whole test case has been exited (cannot translate while there is an active exception)"
                         ,0x91);
          local_38 = 0;
          (**(code **)(*plVar4 + 0x30))(plVar4,&local_50);
          if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
            operator_delete__(local_50.data.ptr);
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar3);
      }
      LOCK();
      *(undefined1 *)(g_cs + 0x115d) = 0;
      UNLOCK();
    }
    puVar3 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar7 = *(undefined8 **)(g_cs + 0x10d0); puVar7 != puVar3; puVar7 = puVar7 + 1) {
      (**(code **)(*(long *)*puVar7 + 0x40))();
    }
  }
  if (((this->m_signature).m_name.field_0.buf[0x17] < '\0') &&
     (pcVar5 = (this->m_signature).m_name.field_0.data.ptr, pcVar5 != (char *)0x0)) {
    operator_delete__(pcVar5);
  }
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            // only mark the subcase stack as passed if no subcases have been skipped
            if(g_cs->should_reenter == false)
                g_cs->subcasesPassed.insert(g_cs->subcasesStack);
            g_cs->subcasesStack.pop_back();

#if defined(__cpp_lib_uncaught_exceptions) && __cpp_lib_uncaught_exceptions >= 201411L && (!defined(__MAC_OS_X_VERSION_MIN_REQUIRED) || __MAC_OS_X_VERSION_MIN_REQUIRED >= 101200)
            if(std::uncaught_exceptions() > 0
#else
            if(std::uncaught_exception()
#endif
            && g_cs->shouldLogCurrentException) {
                DOCTEST_ITERATE_THROUGH_REPORTERS(
                        test_case_exception, {"exception thrown in subcase - will translate later "
                                              "when the whole test case has been exited (cannot "
                                              "translate while there is an active exception)",
                                              false});
                g_cs->shouldLogCurrentException = false;
            }
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }
    }